

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmcset.cpp
# Opt level: O1

int __thiscall CVmObjCharSet::equals(CVmObjCharSet *this,vm_obj_id_t self,vm_val_t *val,int param_3)

{
  char *pcVar1;
  long lVar2;
  size_t len;
  int iVar3;
  bool bVar4;
  bool bVar5;
  
  bVar4 = val->typ != VM_OBJ;
  if (bVar4) {
    bVar5 = false;
  }
  else {
    bVar5 = (val->val).obj == self;
    if (!bVar4 && !bVar5) {
      iVar3 = (**(code **)(*(long *)&G_obj_table_X.pages_[(val->val).obj >> 0xc]
                                     [(val->val).obj & 0xfff].ptr_ + 8))
                        (G_obj_table_X.pages_[(val->val).obj >> 0xc] + ((val->val).obj & 0xfff),
                         metaclass_reg_);
      if (iVar3 != 0) {
        pcVar1 = (this->super_CVmObject).ext_;
        lVar2 = *(long *)((long)&G_obj_table_X.pages_[(val->val).obj >> 0xc][(val->val).obj & 0xfff]
                                 .ptr_ + 8);
        len = *(size_t *)(pcVar1 + 0x10);
        if (len == *(size_t *)(lVar2 + 0x10)) {
          iVar3 = memicmp(pcVar1 + 0x18,(void *)(lVar2 + 0x18),len);
          bVar5 = iVar3 == 0;
          goto LAB_0027c468;
        }
      }
      bVar5 = false;
    }
  }
LAB_0027c468:
  return (int)bVar5;
}

Assistant:

int CVmObjCharSet::equals(VMG_ vm_obj_id_t self, const vm_val_t *val,
                          int /*depth*/) const
{
    CVmObjCharSet *other;
    const vmobj_charset_ext_t *ext;
    const vmobj_charset_ext_t *other_ext;

    /* if it's a self-reference, it's certainly equal */
    if (val->typ == VM_OBJ && val->val.obj == self)
        return TRUE;

    /* if it's not another character set, it's not equal */
    if (val->typ != VM_OBJ || !is_charset(vmg_ val->val.obj))
        return FALSE;

    /* we know it's another character set - cast it */
    other = (CVmObjCharSet *)vm_objp(vmg_ val->val.obj);

    /* get my extension and the other extension */
    ext = get_ext_ptr();
    other_ext = other->get_ext_ptr();

    /* it's equal if it has the same name (ignoring case) */
    return (ext->charset_name_len == other_ext->charset_name_len
            && memicmp(ext->charset_name, other_ext->charset_name,
                       ext->charset_name_len) == 0);
}